

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

int bloaty::SignOf(long val)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (-1 < val) {
    uVar1 = (uint)(val != 0);
  }
  return uVar1;
}

Assistant:

int SignOf(long val) {
  if (val < 0) {
    return -1;
  } else if (val > 0) {
    return 1;
  } else {
    return 0;
  }
}